

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

void uv::TCPClient::ReconnectTimer(uv_timer_t *handle)

{
  char *__s;
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ILog4zManager *pIVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  long *in_FS_OFFSET;
  sockaddr_in6 bind_addr;
  int local_dc;
  undefined1 local_cc [28];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pvVar1 = handle->data;
  if (*(char *)((long)pvVar1 + 0x588) != '\x01') {
    return;
  }
  lVar2 = *in_FS_OFFSET;
  __s = (char *)(lVar2 + -0x800);
  builtin_strncpy(__s,"star",4);
  builtin_strncpy((char *)(lVar2 + -0x7fc),"t re",4);
  builtin_strncpy((char *)(lVar2 + -0x7f8),"conn",4);
  builtin_strncpy((char *)(lVar2 + -0x7f4),"ect.",4);
  *(undefined4 *)(lVar2 + -0x7f0) = 0xa2e2e;
  *(undefined4 *)(lVar2 + -0x7ed) = 0x202820;
  *(undefined2 *)(lVar2 + -0x7ea) = 0x20;
  *(undefined2 *)(lVar2 + -0x7e5) = 0x20;
  *(undefined4 *)(lVar2 + -0x7e9) = 0x3a202920;
  iVar4 = snprintf((char *)(lVar2 + -0x7e4),0x7e4,"%d",0x20e);
  if (iVar4 < 0) {
    *(char *)(lVar2 + -0x7e4) = '\0';
  }
  else if (0x7e3 < iVar4) {
    *(undefined1 *)(lVar2 + -1) = 0;
  }
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,1);
  iVar4 = uv_tcp_init((long)pvVar1 + 0x90,*(undefined8 *)((long)pvVar1 + 8));
  if (iVar4 != 0) {
    GetUVError_abi_cxx11_(&local_50,iVar4);
    uVar11 = 0;
    uVar5 = snprintf(__s,0x800,"%s",local_50._M_dataplus._M_p);
    if ((int)uVar5 < 0) {
      *__s = '\0';
    }
    else {
      uVar11 = uVar5;
      if (0x7ff < (int)uVar5) {
        *(undefined1 *)(lVar2 + -1) = 0;
        uVar11 = 0x800;
      }
    }
    uVar10 = (ulong)uVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (uVar11 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar6 = snprintf(pcVar12,0x800 - uVar10,"%s"," ( ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b099:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else {
        iVar4 = (int)(0x800 - uVar10);
        if (iVar4 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          goto LAB_0011b099;
        }
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar9 = 0x800 - (int)uVar10;
      iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b0eb:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else if (iVar9 <= iVar6) {
        pcVar12 = (char *)(lVar2 + -1);
        iVar4 = iVar9;
        goto LAB_0011b0eb;
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar9 = 0x800 - (int)uVar10;
      iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ) : ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b13c:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else if (iVar9 <= iVar6) {
        pcVar12 = (char *)(lVar2 + -1);
        iVar4 = iVar9;
        goto LAB_0011b13c;
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar6 = 0x800 - (int)uVar10;
      iVar4 = snprintf(pcVar12,(long)iVar6,"%d",0x212);
      if (-1 < iVar4) {
        if (iVar4 < iVar6) goto LAB_0011b18d;
        pcVar12 = (char *)(lVar2 + -1);
      }
      *pcVar12 = '\0';
    }
LAB_0011b18d:
    pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
    goto LAB_0011b713;
  }
  lVar3 = *(long *)((long)pvVar1 + 8);
  *(long *)lVar3 = lVar3;
  *(void **)(lVar3 + 0x1d8) = pvVar1;
  if (*(char *)((long)pvVar1 + 0x5bc) == '\x01') {
    local_dc = uv_ip6_addr(*(undefined8 *)((long)pvVar1 + 0x598),
                           *(undefined4 *)((long)pvVar1 + 0x5b8),local_cc);
    if (local_dc != 0) {
      GetUVError_abi_cxx11_(&local_70,local_dc);
      uVar11 = 0;
      uVar5 = snprintf(__s,0x800,"%s",local_70._M_dataplus._M_p);
      if ((int)uVar5 < 0) {
        *__s = '\0';
      }
      else {
        uVar11 = uVar5;
        if (0x7ff < (int)uVar5) {
          *(undefined1 *)(lVar2 + -1) = 0;
          uVar11 = 0x800;
        }
      }
      uVar10 = (ulong)uVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (uVar11 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar6 = snprintf(pcVar12,0x800 - uVar10,"%s"," ( ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b29c:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else {
          iVar4 = (int)(0x800 - uVar10);
          if (iVar4 <= iVar6) {
            pcVar12 = (char *)(lVar2 + -1);
            goto LAB_0011b29c;
          }
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar9 = 0x800 - (int)uVar10;
        iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b2ee:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else if (iVar9 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          iVar4 = iVar9;
          goto LAB_0011b2ee;
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar9 = 0x800 - (int)uVar10;
        iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ) : ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b340:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else if (iVar9 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          iVar4 = iVar9;
          goto LAB_0011b340;
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        iVar4 = (int)uVar10;
        uVar8 = 0x21c;
        goto LAB_0011b4bd;
      }
      goto LAB_0011b4d9;
    }
LAB_0011b227:
    iVar4 = 0;
  }
  else {
    local_dc = uv_ip4_addr(*(undefined8 *)((long)pvVar1 + 0x598),
                           *(undefined4 *)((long)pvVar1 + 0x5b8),local_cc);
    if (local_dc == 0) goto LAB_0011b227;
    GetUVError_abi_cxx11_(&local_90,local_dc);
    uVar11 = 0;
    uVar5 = snprintf(__s,0x800,"%s",local_90._M_dataplus._M_p);
    if ((int)uVar5 < 0) {
      *__s = '\0';
    }
    else {
      uVar11 = uVar5;
      if (0x7ff < (int)uVar5) {
        *(undefined1 *)(lVar2 + -1) = 0;
        uVar11 = 0x800;
      }
    }
    uVar10 = (ulong)uVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (uVar11 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar6 = snprintf(pcVar12,0x800 - uVar10,"%s"," ( ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b3e5:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else {
        iVar4 = (int)(0x800 - uVar10);
        if (iVar4 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          goto LAB_0011b3e5;
        }
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar9 = 0x800 - (int)uVar10;
      iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b437:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else if (iVar9 <= iVar6) {
        pcVar12 = (char *)(lVar2 + -1);
        iVar4 = iVar9;
        goto LAB_0011b437;
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      pcVar12 = __s + uVar10;
      iVar9 = 0x800 - (int)uVar10;
      iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ) : ");
      iVar4 = 0;
      if (iVar6 < 0) {
LAB_0011b489:
        iVar6 = iVar4;
        *pcVar12 = '\0';
      }
      else if (iVar9 <= iVar6) {
        pcVar12 = (char *)(lVar2 + -1);
        iVar4 = iVar9;
        goto LAB_0011b489;
      }
      uVar10 = uVar10 + (long)iVar6;
    }
    if ((long)uVar10 < 0x800) {
      iVar4 = (int)uVar10;
      uVar8 = 0x225;
LAB_0011b4bd:
      pcVar12 = __s + uVar10;
      iVar6 = snprintf(pcVar12,(long)(0x800 - iVar4),"%d",uVar8);
      if (-1 < iVar6) {
        if (iVar6 < 0x800 - iVar4) goto LAB_0011b4d9;
        pcVar12 = (char *)(lVar2 + -1);
      }
      *pcVar12 = '\0';
    }
LAB_0011b4d9:
    pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
    uv_close(*(undefined8 *)((long)pvVar1 + 8),0);
    iVar4 = 2;
  }
  if (local_dc == 0) {
    iVar4 = uv_tcp_connect((long)pvVar1 + 0x3f0,*(undefined8 *)((long)pvVar1 + 8),local_cc,
                           AfterConnect);
    if (iVar4 == 0) {
      iVar4 = 1;
    }
    else {
      GetUVError_abi_cxx11_(&local_b0,iVar4);
      uVar11 = 0;
      uVar5 = snprintf(__s,0x800,"%s",local_b0._M_dataplus._M_p);
      if ((int)uVar5 < 0) {
        *__s = '\0';
      }
      else {
        uVar11 = uVar5;
        if (0x7ff < (int)uVar5) {
          *(undefined1 *)(lVar2 + -1) = 0;
          uVar11 = 0x800;
        }
      }
      uVar10 = (ulong)uVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (uVar11 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar6 = snprintf(pcVar12,0x800 - uVar10,"%s"," ( ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b5ec:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else {
          iVar4 = (int)(0x800 - uVar10);
          if (iVar4 <= iVar6) {
            pcVar12 = (char *)(lVar2 + -1);
            goto LAB_0011b5ec;
          }
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar9 = 0x800 - (int)uVar10;
        iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b63e:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else if (iVar9 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          iVar4 = iVar9;
          goto LAB_0011b63e;
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar9 = 0x800 - (int)uVar10;
        iVar6 = snprintf(pcVar12,(long)iVar9,"%s"," ) : ");
        iVar4 = 0;
        if (iVar6 < 0) {
LAB_0011b68f:
          iVar6 = iVar4;
          *pcVar12 = '\0';
        }
        else if (iVar9 <= iVar6) {
          pcVar12 = (char *)(lVar2 + -1);
          iVar4 = iVar9;
          goto LAB_0011b68f;
        }
        uVar10 = uVar10 + (long)iVar6;
      }
      if ((long)uVar10 < 0x800) {
        pcVar12 = __s + uVar10;
        iVar6 = 0x800 - (int)uVar10;
        iVar4 = snprintf(pcVar12,(long)iVar6,"%d",0x22d);
        if (-1 < iVar4) {
          if (iVar4 < iVar6) goto LAB_0011b6e0;
          pcVar12 = (char *)(lVar2 + -1);
        }
        *pcVar12 = '\0';
      }
LAB_0011b6e0:
      pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
      uv_close(*(undefined8 *)((long)pvVar1 + 8),0);
      iVar4 = 2;
    }
  }
  if (iVar4 != 2) {
    return;
  }
LAB_0011b713:
  uv_timer_stop(handle);
  lVar2 = *(long *)((long)pvVar1 + 0x590) * 2;
  *(long *)((long)pvVar1 + 0x590) = lVar2;
  uv_timer_start(handle,ReconnectTimer,lVar2);
  return;
}

Assistant:

void TCPClient::ReconnectTimer(uv_timer_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    if (!theclass->isreconnecting_) {
        return;
    }
    LOGI("start reconnect...\n");
    do {
        int iret = uv_tcp_init(&theclass->loop_, &theclass->client_handle_->tcphandle);
        if (iret) {
            LOGE(GetUVError(iret));
            break;
        }
        theclass->client_handle_->tcphandle.data = theclass->client_handle_;
        theclass->client_handle_->parent_server = theclass;
        struct sockaddr* pAddr;
        if (theclass->isIPv6_) {
            struct sockaddr_in6 bind_addr;
            int iret = uv_ip6_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        } else {
            struct sockaddr_in bind_addr;
            int iret = uv_ip4_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        }
        iret = uv_tcp_connect(&theclass->connect_req_, &theclass->client_handle_->tcphandle, (const sockaddr*)pAddr, AfterConnect);
        if (iret) {
            LOGE(GetUVError(iret));
            uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
            break;
        }
        return;
    } while (0);
    //reconnect failure, restart timer to trigger reconnect.
    uv_timer_stop(handle);
    theclass->repeat_time_ *= 2;
    uv_timer_start(handle, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
}